

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataQueryDatumSpecification.cpp
# Opt level: O0

int __thiscall
DIS::DataQueryDatumSpecification::getMarshalledSize(DataQueryDatumSpecification *this)

{
  undefined8 uVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  undefined1 local_58 [8];
  UnsignedDISInteger listElement_1;
  unsigned_long_long idx_1;
  undefined1 local_30 [8];
  UnsignedDISInteger listElement;
  unsigned_long_long idx;
  int marshalSize;
  DataQueryDatumSpecification *this_local;
  
  idx._4_4_ = 8;
  listElement._val = 0;
  listElement._12_4_ = 0;
  while( true ) {
    uVar1 = listElement._8_8_;
    sVar3 = std::vector<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>::size
                      (&this->_fixedDatumIDList);
    if (sVar3 <= (ulong)uVar1) break;
    pvVar4 = std::vector<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>::
             operator[](&this->_fixedDatumIDList,listElement._8_8_);
    UnsignedDISInteger::UnsignedDISInteger((UnsignedDISInteger *)local_30,pvVar4);
    iVar2 = UnsignedDISInteger::getMarshalledSize((UnsignedDISInteger *)local_30);
    idx._4_4_ = idx._4_4_ + iVar2;
    UnsignedDISInteger::~UnsignedDISInteger((UnsignedDISInteger *)local_30);
    listElement._8_8_ = listElement._8_8_ + 1;
  }
  listElement_1._val = 0;
  listElement_1._12_4_ = 0;
  while( true ) {
    uVar1 = listElement_1._8_8_;
    sVar3 = std::vector<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>::size
                      (&this->_variableDatumIDList);
    if (sVar3 <= (ulong)uVar1) break;
    pvVar4 = std::vector<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>::
             operator[](&this->_variableDatumIDList,listElement_1._8_8_);
    UnsignedDISInteger::UnsignedDISInteger((UnsignedDISInteger *)local_58,pvVar4);
    iVar2 = UnsignedDISInteger::getMarshalledSize((UnsignedDISInteger *)local_58);
    idx._4_4_ = idx._4_4_ + iVar2;
    UnsignedDISInteger::~UnsignedDISInteger((UnsignedDISInteger *)local_58);
    listElement_1._8_8_ = listElement_1._8_8_ + 1;
  }
  return idx._4_4_;
}

Assistant:

int DataQueryDatumSpecification::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 4;  // _numberOfFixedDatums
   marshalSize = marshalSize + 4;  // _numberOfVariableDatums

   for(unsigned long long idx=0; idx < _fixedDatumIDList.size(); idx++)
   {
        UnsignedDISInteger listElement = _fixedDatumIDList[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }


   for(unsigned long long idx=0; idx < _variableDatumIDList.size(); idx++)
   {
        UnsignedDISInteger listElement = _variableDatumIDList[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}